

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O3

void __thiscall gjkepa2_impl::GJK::getsupport(GJK *this,btVector3 *d,sSV *sv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  code *pcVar3;
  long *plVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar5 = d->m_floats[2];
  fVar8 = (float)*(undefined8 *)d->m_floats;
  fVar9 = (float)((ulong)*(undefined8 *)d->m_floats >> 0x20);
  fVar10 = 1.0 / SQRT(fVar5 * fVar5 + fVar8 * fVar8 + fVar9 * fVar9);
  fVar5 = fVar5 * fVar10;
  auVar2._4_4_ = fVar10 * fVar9;
  auVar2._0_4_ = fVar10 * fVar8;
  auVar2._8_4_ = fVar5;
  auVar2._12_4_ = 0;
  *(undefined1 (*) [16])(sv->d).m_floats = auVar2;
  pcVar3 = (code *)(this->m_shape).Ls;
  plVar4 = (long *)((long)&((this->m_shape).m_shapes[0]->super_btCollisionShape).
                           _vptr_btCollisionShape + *(long *)&(this->m_shape).field_0x88);
  if (((ulong)pcVar3 & 1) != 0) {
    pcVar3 = *(code **)(pcVar3 + *plVar4 + -1);
  }
  uVar6 = (*pcVar3)(plVar4,sv);
  pcVar3 = (code *)(this->m_shape).Ls;
  if (((ulong)pcVar3 & 1) != 0) {
    pcVar3 = *(code **)(pcVar3 + *(long *)((long)&((this->m_shape).m_shapes[1]->
                                                  super_btCollisionShape)._vptr_btCollisionShape +
                                          *(long *)&(this->m_shape).field_0x88) + -1);
  }
  fVar10 = (sv->d).m_floats[1] * (this->m_shape).m_toshape1.m_el[2].m_floats[1];
  uVar7 = (*pcVar3)();
  fVar9 = (float)((ulong)uVar7 >> 0x20);
  fVar8 = (float)uVar7;
  uVar7 = *(undefined8 *)(this->m_shape).m_toshape0.m_origin.m_floats;
  auVar1._4_4_ = (float)((ulong)uVar6 >> 0x20) -
                 ((float)((ulong)uVar7 >> 0x20) +
                 (this->m_shape).m_toshape0.m_basis.m_el[1].m_floats[2] * fVar10 +
                 (this->m_shape).m_toshape0.m_basis.m_el[1].m_floats[0] * fVar8 +
                 (this->m_shape).m_toshape0.m_basis.m_el[1].m_floats[1] * fVar9);
  auVar1._0_4_ = (float)uVar6 -
                 ((float)uVar7 +
                 (this->m_shape).m_toshape0.m_basis.m_el[0].m_floats[2] * fVar10 +
                 (this->m_shape).m_toshape0.m_basis.m_el[0].m_floats[0] * fVar8 +
                 (this->m_shape).m_toshape0.m_basis.m_el[0].m_floats[1] * fVar9);
  auVar1._8_4_ = fVar5 - ((this->m_shape).m_toshape0.m_basis.m_el[2].m_floats[2] * fVar10 +
                          (this->m_shape).m_toshape0.m_basis.m_el[2].m_floats[0] * fVar8 +
                          (this->m_shape).m_toshape0.m_basis.m_el[2].m_floats[1] * fVar9 +
                         (this->m_shape).m_toshape0.m_origin.m_floats[2]);
  auVar1._12_4_ = 0;
  *(undefined1 (*) [16])(sv->w).m_floats = auVar1;
  return;
}

Assistant:

void				getsupport(const btVector3& d,sSV& sv) const
			{
				sv.d	=	d/d.length();
				sv.w	=	m_shape.Support(sv.d);
			}